

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValueWithAutoDereference
          (cmConditionEvaluator *this,cmExpandedCommandArgument *newArg,string *errorString,
          MessageType *status,bool oneArg)

{
  string *psVar1;
  PolicyID id;
  PolicyID id_00;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  byte local_33;
  byte local_32;
  byte local_31;
  bool oldResult;
  bool newResult;
  MessageType *pMStack_30;
  bool oneArg_local;
  MessageType *status_local;
  string *errorString_local;
  cmExpandedCommandArgument *newArg_local;
  cmConditionEvaluator *this_local;
  
  local_31 = oneArg;
  pMStack_30 = status;
  status_local = (MessageType *)errorString;
  errorString_local = &newArg->Value;
  newArg_local = (cmExpandedCommandArgument *)this;
  if (this->Policy12Status == NEW) {
    this_local._7_1_ = GetBooleanValue(this,newArg);
  }
  else if (this->Policy12Status == OLD) {
    this_local._7_1_ = GetBooleanValueOld(this,newArg,oneArg);
  }
  else {
    local_32 = GetBooleanValue(this,newArg);
    local_33 = GetBooleanValueOld(this,(cmExpandedCommandArgument *)errorString_local,
                                  (bool)(local_31 & 1));
    if ((local_32 & 1) != local_33) {
      switch(this->Policy12Status) {
      case WARN:
        psVar1 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)errorString_local);
        std::operator+(&local_98,"An argument named \"",psVar1);
        std::operator+(&local_78,&local_98,"\" appears in a conditional statement.  ");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_c8,(cmPolicies *)0xc,id);
        std::operator+(&local_58,&local_78,&local_c8);
        std::__cxx11::string::operator=((string *)status_local,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        *pMStack_30 = AUTHOR_WARNING;
      case OLD:
        return (bool)(local_33 & 1);
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        psVar1 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)errorString_local);
        std::operator+(&local_128,"An argument named \"",psVar1);
        std::operator+(&local_108,&local_128,"\" appears in a conditional statement.  ");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_148,(cmPolicies *)0xc,id_00);
        std::operator+(&local_e8,&local_108,&local_148);
        std::__cxx11::string::operator=((string *)status_local,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        *pMStack_30 = FATAL_ERROR;
      case NEW:
      }
    }
    this_local._7_1_ = (bool)(local_32 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueWithAutoDereference(
  cmExpandedCommandArgument& newArg, std::string& errorString,
  MessageType& status, bool oneArg) const
{
  // Use the policy if it is set.
  if (this->Policy12Status == cmPolicies::NEW) {
    return GetBooleanValue(newArg);
  }
  if (this->Policy12Status == cmPolicies::OLD) {
    return GetBooleanValueOld(newArg, oneArg);
  }

  // Check policy only if old and new results differ.
  bool newResult = this->GetBooleanValue(newArg);
  bool oldResult = this->GetBooleanValueOld(newArg, oneArg);
  if (newResult != oldResult) {
    switch (this->Policy12Status) {
      case cmPolicies::WARN:
        errorString = "An argument named \"" + newArg.GetValue() +
          "\" appears in a conditional statement.  " +
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0012);
        status = MessageType::AUTHOR_WARNING;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return oldResult;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        errorString = "An argument named \"" + newArg.GetValue() +
          "\" appears in a conditional statement.  " +
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0012);
        status = MessageType::FATAL_ERROR;
      }
      case cmPolicies::NEW:
        break;
    }
  }
  return newResult;
}